

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::ObjFileImporter::CanRead
          (ObjFileImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  ObjFileImporter *this_local;
  
  if (checkSig) {
    this_local._7_1_ =
         BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,CanRead::pTokens,9,200,false,true);
  }
  else {
    this_local._7_1_ = BaseImporter::SimpleExtensionCheck(pFile,"obj",(char *)0x0,(char *)0x0);
  }
  return this_local._7_1_;
}

Assistant:

bool ObjFileImporter::CanRead( const std::string& pFile, IOSystem*  pIOHandler , bool checkSig ) const {
    if(!checkSig)  {
        //Check File Extension
        return SimpleExtensionCheck(pFile,"obj");
    } else {
        // Check file Header
        static const char *pTokens[] = { "mtllib", "usemtl", "v ", "vt ", "vn ", "o ", "g ", "s ", "f " };
        return BaseImporter::SearchFileHeaderForToken(pIOHandler, pFile, pTokens, 9, 200, false, true );
    }
}